

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O0

void clunk::ClearKingDirs<true>(int from)

{
  uint to_00;
  int iVar1;
  int iVar2;
  uint local_24;
  int to;
  int dir;
  int end;
  uint64_t mvs;
  int from_local;
  
  if ((from & 0xffffff88U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x281,"void clunk::ClearKingDirs(const int) [color = true]");
  }
  _dir = *(ulong *)(_queenKing + (long)from * 8);
  do {
    if (_dir == 0) {
      return;
    }
    if ((_dir & 0xff) == 0) {
      __assert_fail("mvs & 0xFF",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x283,"void clunk::ClearKingDirs(const int) [color = true]");
    }
    to_00 = ((uint)_dir & 0xff) - 1;
    iVar1 = Direction(from,to_00);
    if ((((iVar1 != -0x11 && iVar1 != -0xf) && iVar1 != 0xf) && iVar1 != 0x11) &&
        (((iVar1 != -0x10 && iVar1 != -1) && iVar1 != 1) && iVar1 != 0x10)) {
      __assert_fail("IS_DIR(dir)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x286,"void clunk::ClearKingDirs(const int) [color = true]");
    }
    local_24 = from + iVar1;
    while( true ) {
      if ((local_24 & 0xffffff88) != 0) {
        __assert_fail("IS_SQUARE(to)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x288,"void clunk::ClearKingDirs(const int) [color = true]");
      }
      iVar2 = Direction(from,local_24);
      if (iVar2 != iVar1) {
        __assert_fail("Direction(from, to) == dir",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x289,"void clunk::ClearKingDirs(const int) [color = true]");
      }
      if ((_kingDir[(int)(local_24 + 8)] == '\0') ||
         (_kingDir[(int)(local_24 + 8)] = 0, local_24 == to_00)) break;
      local_24 = iVar1 + local_24;
    }
    _dir = _dir >> 8;
  } while( true );
}

Assistant:

void ClearKingDirs(const int from) {
  assert(IS_SQUARE(from));
  for (uint64_t mvs = _queenKing[from]; mvs; mvs >>= 8) {
    assert(mvs & 0xFF);
    const int end = ((mvs & 0xFF) - 1);
    const int dir = Direction(from, end);
    assert(IS_DIR(dir));
    for (int to = (from + dir);; to += dir) {
      assert(IS_SQUARE(to));
      assert(Direction(from, to) == dir);
      if (_kingDir[to + (color * 8)]) {
        _kingDir[to + (color * 8)] = 0;
      }
      else {
        break;
      }
      if (to == end) {
        break;
      }
    }
  }
}